

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeConcatLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  LogMessage *pLVar1;
  mapped_type *pmVar2;
  mapped_type *this_00;
  ShapeRange *pSVar3;
  Type *__k;
  LayerUnion LVar4;
  int index;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  *this_01;
  ShapeRange outShape;
  ShapeRange local_118;
  ShapeRange local_f8;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_a0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
  }
  this_01 = &this->blobShapes;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](this_01,(key_type *)
                                ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_d8,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](this_01,(key_type *)
                                 ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]
                        );
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_118,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  ShapeConstraint::setName
            (this_00,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  ShapeRange::ShapeRange(&local_118);
  if (specLayer->_oneof_case_[0] == 0x140) {
    LVar4 = specLayer->layer_;
  }
  else {
    LVar4.concat_ = Specification::ConcatLayerParams::default_instance();
  }
  if ((LVar4.mvn_)->acrosschannels_ == true) {
    pSVar3 = ShapeConstraint::sequenceRange(pmVar2);
    local_118._minimum._isUnbound = (pSVar3->_minimum)._isUnbound;
    local_118._minimum._1_7_ = *(undefined7 *)&(pSVar3->_minimum).field_0x1;
    local_118._minimum._val = (pSVar3->_minimum)._val;
    local_118._maximum._isUnbound = (pSVar3->_maximum)._isUnbound;
    local_118._maximum._1_7_ = *(undefined7 *)&(pSVar3->_maximum).field_0x1;
    local_118._maximum._val = (pSVar3->_maximum)._val;
    pSVar3 = ShapeConstraint::channelRange(pmVar2);
    ShapeConstraint::updateChannelRange(this_00,pSVar3);
  }
  else {
    pSVar3 = ShapeConstraint::channelRange(pmVar2);
    local_118._minimum._isUnbound = (pSVar3->_minimum)._isUnbound;
    local_118._minimum._1_7_ = *(undefined7 *)&(pSVar3->_minimum).field_0x1;
    local_118._minimum._val = (pSVar3->_minimum)._val;
    local_118._maximum._isUnbound = (pSVar3->_maximum)._isUnbound;
    local_118._maximum._1_7_ = *(undefined7 *)&(pSVar3->_maximum).field_0x1;
    local_118._maximum._val = (pSVar3->_maximum)._val;
    pSVar3 = ShapeConstraint::sequenceRange(pmVar2);
    ShapeConstraint::updateSequenceRange(this_00,pSVar3);
  }
  pSVar3 = ShapeConstraint::batchRange(pmVar2);
  ShapeConstraint::updateBatchRange(this_00,pSVar3);
  pSVar3 = ShapeConstraint::heightRange(pmVar2);
  ShapeConstraint::updateHeightRange(this_00,pSVar3);
  pSVar3 = ShapeConstraint::widthRange(pmVar2);
  ShapeConstraint::updateWidthRange(this_00,pSVar3);
  if (1 < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_) {
    index = 1;
    do {
      __k = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                      (&(specLayer->input_).super_RepeatedPtrFieldBase,index);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
               ::operator[](this_01,__k);
      if (specLayer->_oneof_case_[0] == 0x140) {
        LVar4 = specLayer->layer_;
      }
      else {
        LVar4.concat_ = Specification::ConcatLayerParams::default_instance();
      }
      if ((LVar4.mvn_)->acrosschannels_ == true) {
        pSVar3 = ShapeConstraint::sequenceRange(pmVar2);
        ShapeRange::operator+(&local_f8,&local_118,pSVar3);
        local_118._maximum._isUnbound = local_f8._maximum._isUnbound;
        local_118._maximum._1_7_ = local_f8._maximum._1_7_;
        local_118._maximum._val = local_f8._maximum._val;
        local_118._minimum._isUnbound = local_f8._minimum._isUnbound;
        local_118._minimum._1_7_ = local_f8._minimum._1_7_;
        local_118._minimum._val = local_f8._minimum._val;
        pSVar3 = ShapeConstraint::channelRange(pmVar2);
        ShapeConstraint::updateChannelRange(this_00,pSVar3);
        pSVar3 = ShapeConstraint::channelRange(this_00);
        ShapeConstraint::updateChannelRange(pmVar2,pSVar3);
      }
      else {
        pSVar3 = ShapeConstraint::channelRange(pmVar2);
        ShapeRange::operator+(&local_f8,&local_118,pSVar3);
        local_118._maximum._isUnbound = local_f8._maximum._isUnbound;
        local_118._maximum._1_7_ = local_f8._maximum._1_7_;
        local_118._maximum._val = local_f8._maximum._val;
        local_118._minimum._isUnbound = local_f8._minimum._isUnbound;
        local_118._minimum._1_7_ = local_f8._minimum._1_7_;
        local_118._minimum._val = local_f8._minimum._val;
        pSVar3 = ShapeConstraint::sequenceRange(pmVar2);
        ShapeConstraint::updateSequenceRange(this_00,pSVar3);
        pSVar3 = ShapeConstraint::sequenceRange(this_00);
        ShapeConstraint::updateSequenceRange(pmVar2,pSVar3);
      }
      pSVar3 = ShapeConstraint::batchRange(pmVar2);
      ShapeConstraint::updateBatchRange(this_00,pSVar3);
      pSVar3 = ShapeConstraint::batchRange(this_00);
      ShapeConstraint::updateBatchRange(pmVar2,pSVar3);
      pSVar3 = ShapeConstraint::heightRange(pmVar2);
      ShapeConstraint::updateHeightRange(this_00,pSVar3);
      pSVar3 = ShapeConstraint::heightRange(this_00);
      ShapeConstraint::updateHeightRange(pmVar2,pSVar3);
      pSVar3 = ShapeConstraint::widthRange(pmVar2);
      ShapeConstraint::updateWidthRange(this_00,pSVar3);
      pSVar3 = ShapeConstraint::widthRange(this_00);
      ShapeConstraint::updateWidthRange(pmVar2,pSVar3);
      index = index + 1;
    } while (index < (specLayer->input_).super_RepeatedPtrFieldBase.current_size_);
  }
  if (specLayer->_oneof_case_[0] == 0x140) {
    LVar4 = specLayer->layer_;
  }
  else {
    LVar4.concat_ = Specification::ConcatLayerParams::default_instance();
  }
  if ((LVar4.mvn_)->acrosschannels_ == false) {
    ShapeConstraint::updateChannelRange(this_00,&local_118);
  }
  else {
    ShapeConstraint::updateSequenceRange(this_00,&local_118);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapeConcatLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Concat layer " << specLayer.name() << " input shapes (before): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Concat layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    ShapeRange outShape;
    if (specLayer.concat().sequenceconcat()) {
        outShape = inputShape.sequenceRange();
        outputShape.updateChannelRange(inputShape.channelRange());
    }
    else {
        outShape = inputShape.channelRange();
        outputShape.updateSequenceRange(inputShape.sequenceRange());
    }
    outputShape.updateBatchRange(inputShape.batchRange());
    outputShape.updateHeightRange(inputShape.heightRange());
    outputShape.updateWidthRange(inputShape.widthRange());

    for (int i = 1; i < specLayer.input_size(); i++) {
        ShapeConstraint& inputShapei = blobShapes[specLayer.input(i)];
        if (specLayer.concat().sequenceconcat()) {
            outShape = outShape + inputShapei.sequenceRange();
            outputShape.updateChannelRange(inputShapei.channelRange());
            inputShapei.updateChannelRange(outputShape.channelRange());
        }
        else {
            outShape = outShape + inputShapei.channelRange();
            outputShape.updateSequenceRange(inputShapei.sequenceRange());
            inputShapei.updateSequenceRange(outputShape.sequenceRange());
        }
        outputShape.updateBatchRange(inputShapei.batchRange());
        inputShapei.updateBatchRange(outputShape.batchRange());

        outputShape.updateHeightRange(inputShapei.heightRange());
        inputShapei.updateHeightRange(outputShape.heightRange());

        outputShape.updateWidthRange(inputShapei.widthRange());
        inputShapei.updateWidthRange(outputShape.widthRange());

    }

    if (specLayer.concat().sequenceconcat()) {
        outputShape.updateSequenceRange(outShape);
    }
    else {
        outputShape.updateChannelRange(outShape);
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Concat layer " << specLayer.name() << " input shapes (after): " << std::endl;
    for (int i = 0; i < specLayer.input_size(); i++) {
        std::cout << blobShapes[specLayer.input(i)];
    }
    std::cout << "Concat layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}